

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppBase::onUnsat(ClaspAppBase *this)

{
  Model *in_stack_00000010;
  Solver *in_stack_00000018;
  ClaspAppBase *in_stack_00000020;
  
  onUnsat(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

bool ClaspAppBase::onUnsat(const Solver& s, const Model& m) {
	bool ret = true;
	if (out_.get() && !out_->quiet()) {
		blockSignals();
		ret = out_->onUnsat(s, m);
		unblockSignals(true);
	}
	return ret;
}